

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_jnt_convolve_avx2.c
# Opt level: O0

void av1_highbd_dist_wtd_convolve_y_avx2
               (uint16_t *src,int src_stride,uint16_t *dst0,int dst_stride0,int w,int h,
               InterpFilterParams *filter_params_y,int subpel_y_qn,ConvolveParams *conv_params,
               int bd)

{
  undefined1 (*pauVar1) [16];
  long lVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  char cVar45;
  ushort uVar46;
  long lVar47;
  undefined8 *puVar48;
  int in_ECX;
  uint uVar49;
  uint uVar50;
  int iVar51;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  undefined1 auVar52 [16];
  undefined1 auVar55 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar56 [64];
  long in_stack_00000008;
  undefined4 in_stack_0000001c;
  __m128i res_1_3;
  __m128i res_0_3;
  __m256i res_16b_3;
  __m128i res_1_2;
  __m128i res_0_2;
  __m256i res_clip_1;
  __m256i res_16b_2;
  __m256i round_result_hi;
  __m256i round_result_lo;
  __m256i comp_avg_res_hi;
  __m256i comp_avg_res_lo;
  __m256i data_ref_0_hi;
  __m256i data_ref_0_lo;
  __m256i data_01_1;
  __m256i data_1_1;
  __m256i data_0_1;
  __m256i res_unsigned_hi;
  __m256i res_b_round;
  __m256i res_b;
  __m128i res_1_1;
  __m128i res_0_1;
  __m256i res_16b_1;
  __m128i res_1;
  __m128i res_0;
  __m256i res_clip;
  __m256i res_16b;
  __m256i round_result;
  __m256i comp_avg_res;
  __m256i data_ref_0;
  __m256i data_01;
  __m256i data_1;
  __m256i data_0;
  __m256i res_unsigned_lo;
  __m256i res_a_round;
  __m256i res_a;
  __m256i s78;
  __m256i s67;
  __m256i s56;
  __m256i s45;
  __m256i s34;
  __m256i s23;
  __m256i s12;
  __m256i s01;
  __m256i src6;
  uint16_t *data;
  __m256i zero;
  __m256i clip_pixel_to_bd;
  __m256i rounding_const;
  int rounding_shift;
  __m256i offset_const;
  int offset;
  int offset_0;
  __m128i round_shift_bits;
  __m128i round_shift_y;
  __m256i round_const_y;
  __m256i wt1;
  __m256i wt0;
  int w1;
  int w0;
  int use_dist_wtd_comp_avg;
  int do_average;
  __m256i coeffs_y [4];
  __m256i s [8];
  int j;
  int i;
  int bits;
  uint16_t *src_ptr;
  int fo_vert;
  int dst_stride;
  CONV_BUF_TYPE *dst;
  undefined4 in_stack_ffffffffffffeb78;
  undefined2 in_stack_ffffffffffffeb7c;
  undefined4 uVar57;
  uint subpel_q4;
  uint uVar58;
  undefined3 in_stack_ffffffffffffeb90;
  undefined4 uVar59;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  __m256i *in_stack_ffffffffffffebe8;
  __m256i *in_stack_ffffffffffffebf0;
  __m256i *in_stack_ffffffffffffebf8;
  __m256i *wt0_00;
  undefined1 local_1400 [32];
  __m256i *palStack_13e8;
  undefined8 local_1240;
  undefined8 uStack_1210;
  undefined8 local_1200;
  undefined8 uStack_11d0;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  byte local_ec4;
  byte local_e84;
  int local_c5c;
  int local_c58;
  ulong local_c10;
  ulong local_bf0;
  ulong uStack_bb8;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_70;
  undefined8 uStack_68;
  __m256i *res_unsigned;
  __m256i *data_ref_0_00;
  
  lVar5 = *(long *)(CONCAT44(in_stack_0000001c,subpel_y_qn) + 8);
  iVar3 = *(int *)(CONCAT44(in_stack_0000001c,subpel_y_qn) + 0x10);
  lVar47 = in_RDI + (long)(int)(((*(ushort *)(in_stack_00000008 + 8) >> 1) - 1) * in_ESI) * -2;
  iVar4 = *(int *)CONCAT44(in_stack_0000001c,subpel_y_qn);
  subpel_q4 = *(uint *)(CONCAT44(in_stack_0000001c,subpel_y_qn) + 0x28);
  uVar58 = *(uint *)(CONCAT44(in_stack_0000001c,subpel_y_qn) + 0x2c);
  auVar6 = vpinsrd_avx(ZEXT416(subpel_q4),subpel_q4,1);
  auVar6 = vpinsrd_avx(auVar6,subpel_q4,2);
  vpinsrd_avx(auVar6,subpel_q4,3);
  auVar6 = vpinsrd_avx(ZEXT416(subpel_q4),subpel_q4,1);
  auVar6 = vpinsrd_avx(auVar6,subpel_q4,2);
  vpinsrd_avx(auVar6,subpel_q4,3);
  auVar6 = vpinsrd_avx(ZEXT416(uVar58),uVar58,1);
  auVar6 = vpinsrd_avx(auVar6,uVar58,2);
  vpinsrd_avx(auVar6,uVar58,3);
  auVar6 = vpinsrd_avx(ZEXT416(uVar58),uVar58,1);
  auVar6 = vpinsrd_avx(auVar6,uVar58,2);
  vpinsrd_avx(auVar6,uVar58,3);
  uVar49 = (1 << (*(byte *)(CONCAT44(in_stack_0000001c,subpel_y_qn) + 0x18) & 0x1f)) >> 1;
  auVar6 = vpinsrd_avx(ZEXT416(uVar49),uVar49,1);
  auVar6 = vpinsrd_avx(auVar6,uVar49,2);
  auVar6 = vpinsrd_avx(auVar6,uVar49,3);
  auVar7 = vpinsrd_avx(ZEXT416(uVar49),uVar49,1);
  auVar7 = vpinsrd_avx(auVar7,uVar49,2);
  auVar7 = vpinsrd_avx(auVar7,uVar49,3);
  uStack_130 = auVar7._0_8_;
  uStack_128 = auVar7._8_8_;
  local_bf0 = CONCAT44(0,*(uint *)(CONCAT44(in_stack_0000001c,subpel_y_qn) + 0x18));
  local_c10 = CONCAT44(0,7 - *(int *)(CONCAT44(in_stack_0000001c,subpel_y_qn) + 0x14));
  cVar45 = ((char)conv_params -
           (char)*(undefined4 *)(CONCAT44(in_stack_0000001c,subpel_y_qn) + 0x14)) -
           (char)*(undefined4 *)(CONCAT44(in_stack_0000001c,subpel_y_qn) + 0x18);
  local_e84 = cVar45 + 0xe;
  uVar59 = CONCAT13(local_e84,in_stack_ffffffffffffeb90);
  iVar51 = 1 << (local_e84 & 0x1f);
  uVar50 = iVar51 + (1 << (cVar45 + 0xdU & 0x1f));
  auVar7 = vpinsrd_avx(ZEXT416(uVar50),uVar50,1);
  auVar7 = vpinsrd_avx(auVar7,uVar50,2);
  auVar7 = vpinsrd_avx(auVar7,uVar50,3);
  auVar8 = vpinsrd_avx(ZEXT416(uVar50),uVar50,1);
  auVar8 = vpinsrd_avx(auVar8,uVar50,2);
  auVar8 = vpinsrd_avx(auVar8,uVar50,3);
  uStack_f0 = auVar8._0_8_;
  uStack_e8 = auVar8._8_8_;
  local_ec4 = 0xe - ((char)*(undefined4 *)(CONCAT44(in_stack_0000001c,subpel_y_qn) + 0x14) +
                    (char)*(undefined4 *)(CONCAT44(in_stack_0000001c,subpel_y_qn) + 0x18));
  uVar50 = (1 << (local_ec4 & 0x1f)) >> 1;
  auVar8 = vpinsrd_avx(ZEXT416(uVar50),uVar50,1);
  auVar8 = vpinsrd_avx(auVar8,uVar50,2);
  vpinsrd_avx(auVar8,uVar50,3);
  auVar8 = vpinsrd_avx(ZEXT416(uVar50),uVar50,1);
  auVar8 = vpinsrd_avx(auVar8,uVar50,2);
  vpinsrd_avx(auVar8,uVar50,3);
  if ((int)conv_params == 10) {
    uVar57 = 0x3ff;
  }
  else {
    uVar57 = 0xff;
    if ((int)conv_params == 0xc) {
      uVar57 = 0xfff;
    }
  }
  uVar46 = (ushort)uVar57;
  auVar8 = vpinsrw_avx(ZEXT216(uVar46),uVar57,1);
  auVar8 = vpinsrw_avx(auVar8,uVar57,2);
  auVar8 = vpinsrw_avx(auVar8,uVar57,3);
  auVar8 = vpinsrw_avx(auVar8,uVar57,4);
  auVar8 = vpinsrw_avx(auVar8,uVar57,5);
  auVar8 = vpinsrw_avx(auVar8,uVar57,6);
  auVar8 = vpinsrw_avx(auVar8,uVar57,7);
  auVar52 = vpinsrw_avx(ZEXT216(uVar46),uVar57,1);
  auVar52 = vpinsrw_avx(auVar52,uVar57,2);
  auVar52 = vpinsrw_avx(auVar52,uVar57,3);
  auVar52 = vpinsrw_avx(auVar52,uVar57,4);
  auVar52 = vpinsrw_avx(auVar52,uVar57,5);
  auVar52 = vpinsrw_avx(auVar52,uVar57,6);
  auVar52 = vpinsrw_avx(auVar52,uVar57,7);
  uStack_70 = auVar52._0_8_;
  uStack_68 = auVar52._8_8_;
  uStack_bb8 = SUB328(ZEXT832(0),4);
  auVar56 = ZEXT1664(auVar52);
  prepare_coeffs((InterpFilterParams *)CONCAT44(uVar49,uVar58),subpel_q4,
                 (__m256i *)
                 CONCAT26(uVar46,CONCAT24(in_stack_ffffffffffffeb7c,in_stack_ffffffffffffeb78)));
  for (local_c5c = 0; local_c5c < in_R8D; local_c5c = local_c5c + 8) {
    pauVar1 = (undefined1 (*) [16])(lVar47 + (long)local_c5c * 2);
    uVar9 = *(undefined8 *)(*pauVar1 + (long)in_ESI * 2);
    uVar10 = *(undefined8 *)((long)(*pauVar1 + (long)in_ESI * 2) + 8);
    uVar11 = *(undefined8 *)(*pauVar1 + (long)(in_ESI * 2) * 2);
    uVar12 = *(undefined8 *)((long)(*pauVar1 + (long)(in_ESI * 2) * 2) + 8);
    uVar13 = *(undefined8 *)(*pauVar1 + (long)(in_ESI * 3) * 2);
    uVar14 = *(undefined8 *)((long)(*pauVar1 + (long)(in_ESI * 3) * 2) + 8);
    uVar15 = *(undefined8 *)(*pauVar1 + (long)(in_ESI << 2) * 2);
    uVar16 = *(undefined8 *)((long)(*pauVar1 + (long)(in_ESI << 2) * 2) + 8);
    uVar17 = *(undefined8 *)(*pauVar1 + (long)(in_ESI * 5) * 2);
    uVar18 = *(undefined8 *)((long)(*pauVar1 + (long)(in_ESI * 5) * 2) + 8);
    local_f80 = *(undefined8 *)(*pauVar1 + (long)(in_ESI * 6) * 2);
    uStack_f78 = *(undefined8 *)((long)(*pauVar1 + (long)(in_ESI * 6) * 2) + 8);
    uStack_f70 = auVar56._0_8_;
    uStack_f68 = auVar56._8_8_;
    auVar30._16_8_ = uVar9;
    auVar30._0_16_ = *pauVar1;
    auVar30._24_8_ = uVar10;
    auVar29._16_8_ = uVar11;
    auVar29._0_16_ = *(undefined1 (*) [16])(*pauVar1 + (long)in_ESI * 2);
    auVar29._24_8_ = uVar12;
    vpunpcklwd_avx2(auVar30,auVar29);
    auVar28._16_8_ = uVar13;
    auVar28._0_16_ = *(undefined1 (*) [16])(*pauVar1 + (long)(in_ESI * 2) * 2);
    auVar28._24_8_ = uVar14;
    auVar27._16_8_ = uVar15;
    auVar27._0_16_ = *(undefined1 (*) [16])(*pauVar1 + (long)(in_ESI * 3) * 2);
    auVar27._24_8_ = uVar16;
    vpunpcklwd_avx2(auVar28,auVar27);
    auVar26._16_8_ = uVar17;
    auVar26._0_16_ = *(undefined1 (*) [16])(*pauVar1 + (long)(in_ESI << 2) * 2);
    auVar26._24_8_ = uVar18;
    auVar54._16_8_ = local_f80;
    auVar54._0_16_ = *(undefined1 (*) [16])(*pauVar1 + (long)(in_ESI * 5) * 2);
    auVar54._24_8_ = uStack_f78;
    vpunpcklwd_avx2(auVar26,auVar54);
    auVar37._16_8_ = uVar9;
    auVar37._0_16_ = *pauVar1;
    auVar37._24_8_ = uVar10;
    auVar36._16_8_ = uVar11;
    auVar36._0_16_ = *(undefined1 (*) [16])(*pauVar1 + (long)in_ESI * 2);
    auVar36._24_8_ = uVar12;
    vpunpckhwd_avx2(auVar37,auVar36);
    auVar35._16_8_ = uVar13;
    auVar35._0_16_ = *(undefined1 (*) [16])(*pauVar1 + (long)(in_ESI * 2) * 2);
    auVar35._24_8_ = uVar14;
    auVar34._16_8_ = uVar15;
    auVar34._0_16_ = *(undefined1 (*) [16])(*pauVar1 + (long)(in_ESI * 3) * 2);
    auVar34._24_8_ = uVar16;
    vpunpckhwd_avx2(auVar35,auVar34);
    auVar33._16_8_ = uVar17;
    auVar33._0_16_ = *(undefined1 (*) [16])(*pauVar1 + (long)(in_ESI << 2) * 2);
    auVar33._24_8_ = uVar18;
    auVar53._16_8_ = local_f80;
    auVar53._0_16_ = *(undefined1 (*) [16])(*pauVar1 + (long)(in_ESI * 5) * 2);
    auVar53._24_8_ = uStack_f78;
    vpunpckhwd_avx2(auVar33,auVar53);
    for (local_c58 = 0; auVar56 = ZEXT3264(auVar53), local_c58 < in_R9D; local_c58 = local_c58 + 2)
    {
      lVar2 = lVar47 + (long)(local_c58 * in_ESI + local_c5c) * 2;
      auVar52._8_8_ = uStack_f78;
      auVar52._0_8_ = local_f80;
      auVar23._16_8_ = uStack_f70;
      auVar23._0_16_ = auVar52;
      auVar23._24_8_ = uStack_f68;
      pauVar1 = (undefined1 (*) [16])(lVar2 + (long)(in_ESI * 7) * 2);
      uStack_f70 = *(undefined8 *)*pauVar1;
      uStack_f68 = *(undefined8 *)(*pauVar1 + 8);
      auVar52 = ZEXT116(0) * *pauVar1 + ZEXT116(1) * auVar52;
      auVar55 = ZEXT116(0) * auVar23._16_16_ + ZEXT116(1) * *pauVar1;
      puVar48 = (undefined8 *)(lVar2 + (long)(in_ESI << 3) * 2);
      local_f80 = *puVar48;
      uStack_f78 = puVar48[1];
      pauVar1 = (undefined1 (*) [16])(lVar2 + (long)(in_ESI * 7) * 2);
      uStack_1050 = auVar55._0_8_;
      uStack_1048 = auVar55._8_8_;
      auVar25._16_8_ = uStack_1050;
      auVar25._0_16_ = auVar52;
      auVar25._24_8_ = uStack_1048;
      auVar24._16_8_ = local_f80;
      auVar24._0_16_ = *pauVar1;
      auVar24._24_8_ = uStack_f78;
      vpunpcklwd_avx2(auVar25,auVar24);
      auVar32._16_8_ = uStack_1050;
      auVar32._0_16_ = auVar52;
      auVar32._24_8_ = uStack_1048;
      auVar31._16_8_ = local_f80;
      auVar31._0_16_ = *pauVar1;
      auVar31._24_8_ = uStack_f78;
      auVar53 = vpunpckhwd_avx2(auVar32,auVar31);
      convolve(in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8);
      auVar44._8_8_ = 0;
      auVar44._0_8_ = local_c10;
      auVar53 = vpslld_avx2(auVar53,auVar44);
      auVar41._16_8_ = uStack_130;
      auVar41._0_16_ = auVar6;
      auVar41._24_8_ = uStack_128;
      auVar53 = vpaddd_avx2(auVar53,auVar41);
      auVar55._8_8_ = 0;
      auVar55._0_8_ = local_bf0;
      auVar53 = vpsrad_avx2(auVar53,auVar55);
      auVar40._16_8_ = uStack_f0;
      auVar40._0_16_ = auVar7;
      auVar40._24_8_ = uStack_e8;
      auVar53 = vpaddd_avx2(auVar53,auVar40);
      if (in_R8D - local_c5c < 8) {
        if (iVar4 == 0) {
          auVar54 = vpackusdw_avx2(auVar53,auVar53);
          uStack_1210 = auVar54._16_8_;
          *(undefined8 *)(lVar5 + (long)(local_c58 * iVar3 + local_c5c) * 2) = uStack_1210;
          *(undefined8 *)(lVar5 + (long)(local_c58 * iVar3 + local_c5c + iVar3) * 2) = local_1240;
        }
        else {
          auVar22._8_8_ = 0;
          auVar22._0_8_ = *(ulong *)(lVar5 + (long)(local_c58 * iVar3 + local_c5c) * 2);
          auVar22._16_16_ = auVar7;
          auVar21._8_8_ = 0;
          auVar21._0_8_ = *(ulong *)(lVar5 + (long)(local_c58 * iVar3 + local_c5c + iVar3) * 2);
          auVar21._16_16_ = auVar7;
          auVar53 = vperm2i128_avx2(auVar22,auVar21,0x20);
          auVar53 = vpunpcklwd_avx2(auVar53,ZEXT832(uStack_bb8) << 0x40);
          highbd_comp_avg(data_ref_0_00,res_unsigned,wt0_00,in_stack_ffffffffffffebf8,
                          (int)((ulong)in_stack_ffffffffffffebf0 >> 0x20));
          highbd_convolve_rounding
                    ((__m256i *)CONCAT44(iVar51,uVar59),(__m256i *)CONCAT44(uVar49,uVar58),
                     (__m256i *)CONCAT44(subpel_q4,uVar57),
                     CONCAT22(uVar46,in_stack_ffffffffffffeb7c));
          auVar54 = vpackusdw_avx2(auVar53,auVar53);
          auVar53._16_8_ = uStack_70;
          auVar53._0_16_ = auVar8;
          auVar53._24_8_ = uStack_68;
          auVar54 = vpminsw_avx2(auVar54,auVar53);
          uStack_11d0 = auVar54._16_8_;
          *(undefined8 *)(in_RDX + (long)(local_c58 * in_ECX + local_c5c) * 2) = uStack_11d0;
          *(undefined8 *)(in_RDX + (long)(local_c58 * in_ECX + local_c5c + in_ECX) * 2) = local_1200
          ;
        }
      }
      else {
        auVar54 = auVar53;
        convolve(in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8);
        auVar43._8_8_ = 0;
        auVar43._0_8_ = local_c10;
        auVar54 = vpslld_avx2(auVar54,auVar43);
        auVar39._16_8_ = uStack_130;
        auVar39._0_16_ = auVar6;
        auVar39._24_8_ = uStack_128;
        auVar54 = vpaddd_avx2(auVar54,auVar39);
        auVar42._8_8_ = 0;
        auVar42._0_8_ = local_bf0;
        auVar54 = vpsrad_avx2(auVar54,auVar42);
        auVar38._16_8_ = uStack_f0;
        auVar38._0_16_ = auVar7;
        auVar38._24_8_ = uStack_e8;
        auVar54 = vpaddd_avx2(auVar54,auVar38);
        if (iVar4 == 0) {
          auVar53 = vpackusdw_avx2(auVar53,auVar54);
          local_1440 = auVar53._0_8_;
          uStack_1438 = auVar53._8_8_;
          uStack_1430 = auVar53._16_8_;
          uStack_1428 = auVar53._24_8_;
          puVar48 = (undefined8 *)(lVar5 + (long)(local_c58 * iVar3 + local_c5c) * 2);
          *puVar48 = local_1440;
          puVar48[1] = uStack_1438;
          puVar48 = (undefined8 *)(lVar5 + (long)(local_c58 * iVar3 + local_c5c + iVar3) * 2);
          *puVar48 = uStack_1430;
          puVar48[1] = uStack_1428;
          auVar53 = auVar54;
        }
        else {
          auVar20._16_16_ = auVar7;
          auVar20._0_16_ = *(undefined1 (*) [16])(lVar5 + (long)(local_c58 * iVar3 + local_c5c) * 2)
          ;
          auVar19._16_16_ = auVar7;
          auVar19._0_16_ =
               *(undefined1 (*) [16])(lVar5 + (long)(local_c58 * iVar3 + local_c5c + iVar3) * 2);
          auVar53 = vperm2i128_avx2(auVar20,auVar19,0x20);
          vpunpcklwd_avx2(auVar53,ZEXT832(uStack_bb8) << 0x40);
          auVar53 = vpunpckhwd_avx2(auVar53,ZEXT832(uStack_bb8) << 0x40);
          highbd_comp_avg(data_ref_0_00,res_unsigned,wt0_00,in_stack_ffffffffffffebf8,
                          (int)((ulong)in_stack_ffffffffffffebf0 >> 0x20));
          highbd_comp_avg(data_ref_0_00,res_unsigned,wt0_00,in_stack_ffffffffffffebf8,
                          (int)((ulong)in_stack_ffffffffffffebf0 >> 0x20));
          highbd_convolve_rounding
                    ((__m256i *)CONCAT44(iVar51,uVar59),(__m256i *)CONCAT44(uVar49,uVar58),
                     (__m256i *)CONCAT44(subpel_q4,uVar57),
                     CONCAT22(uVar46,in_stack_ffffffffffffeb7c));
          auVar54 = auVar53;
          highbd_convolve_rounding
                    ((__m256i *)CONCAT44(iVar51,uVar59),(__m256i *)CONCAT44(uVar49,uVar58),
                     (__m256i *)CONCAT44(subpel_q4,uVar57),
                     CONCAT22(uVar46,in_stack_ffffffffffffeb7c));
          auVar54 = vpackusdw_avx2(auVar53,auVar54);
          auVar53._16_8_ = uStack_70;
          auVar53._0_16_ = auVar8;
          auVar53._24_8_ = uStack_68;
          local_1400 = vpminsw_avx2(auVar54,auVar53);
          puVar48 = (undefined8 *)(in_RDX + (long)(local_c58 * in_ECX + local_c5c) * 2);
          *puVar48 = wt0_00;
          puVar48[1] = res_unsigned;
          puVar48 = (undefined8 *)(in_RDX + (long)(local_c58 * in_ECX + local_c5c + in_ECX) * 2);
          *puVar48 = data_ref_0_00;
          puVar48[1] = palStack_13e8;
          in_stack_ffffffffffffebe8 = palStack_13e8;
          in_stack_ffffffffffffebf0 = wt0_00;
          in_stack_ffffffffffffebf8 = res_unsigned;
        }
      }
    }
  }
  return;
}

Assistant:

void av1_highbd_dist_wtd_convolve_y_avx2(
    const uint16_t *src, int src_stride, uint16_t *dst0, int dst_stride0, int w,
    int h, const InterpFilterParams *filter_params_y, const int subpel_y_qn,
    ConvolveParams *conv_params, int bd) {
  CONV_BUF_TYPE *dst = conv_params->dst;
  int dst_stride = conv_params->dst_stride;
  const int fo_vert = filter_params_y->taps / 2 - 1;
  const uint16_t *const src_ptr = src - fo_vert * src_stride;
  const int bits = FILTER_BITS - conv_params->round_0;

  assert(bits >= 0);
  int i, j;
  __m256i s[8], coeffs_y[4];
  const int do_average = conv_params->do_average;
  const int use_dist_wtd_comp_avg = conv_params->use_dist_wtd_comp_avg;

  const int w0 = conv_params->fwd_offset;
  const int w1 = conv_params->bck_offset;
  const __m256i wt0 = _mm256_set1_epi32(w0);
  const __m256i wt1 = _mm256_set1_epi32(w1);
  const __m256i round_const_y =
      _mm256_set1_epi32(((1 << conv_params->round_1) >> 1));
  const __m128i round_shift_y = _mm_cvtsi32_si128(conv_params->round_1);
  const __m128i round_shift_bits = _mm_cvtsi32_si128(bits);

  const int offset_0 =
      bd + 2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset = (1 << offset_0) + (1 << (offset_0 - 1));
  const __m256i offset_const = _mm256_set1_epi32(offset);
  const int rounding_shift =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const __m256i rounding_const = _mm256_set1_epi32((1 << rounding_shift) >> 1);
  const __m256i clip_pixel_to_bd =
      _mm256_set1_epi16(bd == 10 ? 1023 : (bd == 12 ? 4095 : 255));
  const __m256i zero = _mm256_setzero_si256();

  prepare_coeffs(filter_params_y, subpel_y_qn, coeffs_y);

  for (j = 0; j < w; j += 8) {
    const uint16_t *data = &src_ptr[j];
    /* Vertical filter */
    {
      __m256i src6;
      __m256i s01 = _mm256_permute2x128_si256(
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 0 * src_stride))),
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 1 * src_stride))),
          0x20);
      __m256i s12 = _mm256_permute2x128_si256(
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 1 * src_stride))),
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 2 * src_stride))),
          0x20);
      __m256i s23 = _mm256_permute2x128_si256(
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 2 * src_stride))),
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 3 * src_stride))),
          0x20);
      __m256i s34 = _mm256_permute2x128_si256(
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 3 * src_stride))),
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 4 * src_stride))),
          0x20);
      __m256i s45 = _mm256_permute2x128_si256(
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 4 * src_stride))),
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 5 * src_stride))),
          0x20);
      src6 = _mm256_castsi128_si256(
          _mm_loadu_si128((__m128i *)(data + 6 * src_stride)));
      __m256i s56 = _mm256_permute2x128_si256(
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 5 * src_stride))),
          src6, 0x20);

      s[0] = _mm256_unpacklo_epi16(s01, s12);
      s[1] = _mm256_unpacklo_epi16(s23, s34);
      s[2] = _mm256_unpacklo_epi16(s45, s56);

      s[4] = _mm256_unpackhi_epi16(s01, s12);
      s[5] = _mm256_unpackhi_epi16(s23, s34);
      s[6] = _mm256_unpackhi_epi16(s45, s56);

      for (i = 0; i < h; i += 2) {
        data = &src_ptr[i * src_stride + j];

        const __m256i s67 = _mm256_permute2x128_si256(
            src6,
            _mm256_castsi128_si256(
                _mm_loadu_si128((__m128i *)(data + 7 * src_stride))),
            0x20);

        src6 = _mm256_castsi128_si256(
            _mm_loadu_si128((__m128i *)(data + 8 * src_stride)));

        const __m256i s78 = _mm256_permute2x128_si256(
            _mm256_castsi128_si256(
                _mm_loadu_si128((__m128i *)(data + 7 * src_stride))),
            src6, 0x20);

        s[3] = _mm256_unpacklo_epi16(s67, s78);
        s[7] = _mm256_unpackhi_epi16(s67, s78);

        const __m256i res_a = convolve(s, coeffs_y);

        __m256i res_a_round = _mm256_sll_epi32(res_a, round_shift_bits);
        res_a_round = _mm256_sra_epi32(
            _mm256_add_epi32(res_a_round, round_const_y), round_shift_y);

        __m256i res_unsigned_lo = _mm256_add_epi32(res_a_round, offset_const);

        if (w - j < 8) {
          if (do_average) {
            const __m256i data_0 = _mm256_castsi128_si256(
                _mm_loadl_epi64((__m128i *)(&dst[i * dst_stride + j])));
            const __m256i data_1 = _mm256_castsi128_si256(_mm_loadl_epi64(
                (__m128i *)(&dst[i * dst_stride + j + dst_stride])));
            const __m256i data_01 =
                _mm256_permute2x128_si256(data_0, data_1, 0x20);

            const __m256i data_ref_0 = _mm256_unpacklo_epi16(data_01, zero);

            const __m256i comp_avg_res =
                highbd_comp_avg(&data_ref_0, &res_unsigned_lo, &wt0, &wt1,
                                use_dist_wtd_comp_avg);

            const __m256i round_result = highbd_convolve_rounding(
                &comp_avg_res, &offset_const, &rounding_const, rounding_shift);

            const __m256i res_16b =
                _mm256_packus_epi32(round_result, round_result);
            const __m256i res_clip =
                _mm256_min_epi16(res_16b, clip_pixel_to_bd);

            const __m128i res_0 = _mm256_castsi256_si128(res_clip);
            const __m128i res_1 = _mm256_extracti128_si256(res_clip, 1);

            _mm_storel_epi64((__m128i *)(&dst0[i * dst_stride0 + j]), res_0);
            _mm_storel_epi64(
                (__m128i *)(&dst0[i * dst_stride0 + j + dst_stride0]), res_1);
          } else {
            __m256i res_16b =
                _mm256_packus_epi32(res_unsigned_lo, res_unsigned_lo);
            const __m128i res_0 = _mm256_castsi256_si128(res_16b);
            const __m128i res_1 = _mm256_extracti128_si256(res_16b, 1);

            _mm_storel_epi64((__m128i *)(&dst[i * dst_stride + j]), res_0);
            _mm_storel_epi64((__m128i *)(&dst[i * dst_stride + j + dst_stride]),
                             res_1);
          }
        } else {
          const __m256i res_b = convolve(s + 4, coeffs_y);
          __m256i res_b_round = _mm256_sll_epi32(res_b, round_shift_bits);
          res_b_round = _mm256_sra_epi32(
              _mm256_add_epi32(res_b_round, round_const_y), round_shift_y);

          __m256i res_unsigned_hi = _mm256_add_epi32(res_b_round, offset_const);

          if (do_average) {
            const __m256i data_0 = _mm256_castsi128_si256(
                _mm_loadu_si128((__m128i *)(&dst[i * dst_stride + j])));
            const __m256i data_1 = _mm256_castsi128_si256(_mm_loadu_si128(
                (__m128i *)(&dst[i * dst_stride + j + dst_stride])));
            const __m256i data_01 =
                _mm256_permute2x128_si256(data_0, data_1, 0x20);

            const __m256i data_ref_0_lo = _mm256_unpacklo_epi16(data_01, zero);
            const __m256i data_ref_0_hi = _mm256_unpackhi_epi16(data_01, zero);

            const __m256i comp_avg_res_lo =
                highbd_comp_avg(&data_ref_0_lo, &res_unsigned_lo, &wt0, &wt1,
                                use_dist_wtd_comp_avg);
            const __m256i comp_avg_res_hi =
                highbd_comp_avg(&data_ref_0_hi, &res_unsigned_hi, &wt0, &wt1,
                                use_dist_wtd_comp_avg);

            const __m256i round_result_lo =
                highbd_convolve_rounding(&comp_avg_res_lo, &offset_const,
                                         &rounding_const, rounding_shift);
            const __m256i round_result_hi =
                highbd_convolve_rounding(&comp_avg_res_hi, &offset_const,
                                         &rounding_const, rounding_shift);

            const __m256i res_16b =
                _mm256_packus_epi32(round_result_lo, round_result_hi);
            const __m256i res_clip =
                _mm256_min_epi16(res_16b, clip_pixel_to_bd);

            const __m128i res_0 = _mm256_castsi256_si128(res_clip);
            const __m128i res_1 = _mm256_extracti128_si256(res_clip, 1);

            _mm_store_si128((__m128i *)(&dst0[i * dst_stride0 + j]), res_0);
            _mm_store_si128(
                (__m128i *)(&dst0[i * dst_stride0 + j + dst_stride0]), res_1);
          } else {
            __m256i res_16b =
                _mm256_packus_epi32(res_unsigned_lo, res_unsigned_hi);
            const __m128i res_0 = _mm256_castsi256_si128(res_16b);
            const __m128i res_1 = _mm256_extracti128_si256(res_16b, 1);

            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j]), res_0);
            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j + dst_stride]),
                            res_1);
          }
        }
        s[0] = s[1];
        s[1] = s[2];
        s[2] = s[3];

        s[4] = s[5];
        s[5] = s[6];
        s[6] = s[7];
      }
    }
  }
}